

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::
str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [2],
          uint *params_2,char (*params_3) [2],uint *params_4,char (*params_5) [10],
          StringPtr *params_6,char (*params_7) [2])

{
  long lVar1;
  ArrayPtr<const_char> *params_7_00;
  long local_c0;
  long local_b8;
  CappedArray<char,_14UL> local_b0;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  lVar1 = *(long *)(this + 8);
  local_c0 = lVar1;
  if (lVar1 != 0) {
    local_c0 = *(long *)this;
  }
  local_b8 = 0;
  if (lVar1 != 0) {
    local_b8 = lVar1 + -1;
  }
  local_58.size_ = strlen((char *)params);
  local_58.ptr = (char *)params;
  _::Stringifier::operator*(&local_b0,(Stringifier *)&_::STR,*(uint *)params_1);
  local_68._8_8_ = strlen((char *)params_2);
  local_68._0_8_ = params_2;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)params_3);
  local_78._8_8_ = strlen((char *)params_4);
  local_78._0_8_ = params_4;
  local_88.ptr = *(char **)*params_5;
  local_88.size_ = *(long *)(*params_5 + 8) - 1;
  params_7_00 = (ArrayPtr<const_char> *)0x1929c7;
  local_98.size_ = strlen((char *)params_6);
  local_98.ptr = (char *)params_6;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_c0,&local_58,(ArrayPtr<const_char> *)&local_b0,
             (CappedArray<char,_14UL> *)local_68,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)local_78,&local_88,&local_98,params_7_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}